

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-blend.c
# Opt level: O0

void plutovg_memfill32(uint *dest,int length,uint value)

{
  undefined8 uVar1;
  undefined8 uVar2;
  __m128i vector_data;
  uint value_local;
  int length_local;
  uint *dest_local;
  
  uVar1 = CONCAT44(value,value);
  uVar2 = CONCAT44(value,value);
  _value_local = dest;
  for (vector_data[1]._4_4_ = length; vector_data[1]._4_4_ != 0 && ((ulong)_value_local & 0xf) != 0;
      vector_data[1]._4_4_ = vector_data[1]._4_4_ + -1) {
    *_value_local = value;
    _value_local = _value_local + 1;
  }
  for (; 0x1f < vector_data[1]._4_4_; vector_data[1]._4_4_ = vector_data[1]._4_4_ + -0x20) {
    *(undefined8 *)_value_local = uVar1;
    *(undefined8 *)(_value_local + 2) = uVar2;
    *(undefined8 *)(_value_local + 4) = uVar1;
    *(undefined8 *)(_value_local + 6) = uVar2;
    *(undefined8 *)(_value_local + 8) = uVar1;
    *(undefined8 *)(_value_local + 10) = uVar2;
    *(undefined8 *)(_value_local + 0xc) = uVar1;
    *(undefined8 *)(_value_local + 0xe) = uVar2;
    *(undefined8 *)(_value_local + 0x10) = uVar1;
    *(undefined8 *)(_value_local + 0x12) = uVar2;
    *(undefined8 *)(_value_local + 0x14) = uVar1;
    *(undefined8 *)(_value_local + 0x16) = uVar2;
    *(undefined8 *)(_value_local + 0x18) = uVar1;
    *(undefined8 *)(_value_local + 0x1a) = uVar2;
    *(undefined8 *)(_value_local + 0x1c) = uVar1;
    *(undefined8 *)(_value_local + 0x1e) = uVar2;
    _value_local = _value_local + 0x20;
  }
  if (0xf < vector_data[1]._4_4_) {
    *(undefined8 *)_value_local = uVar1;
    *(undefined8 *)(_value_local + 2) = uVar2;
    *(undefined8 *)(_value_local + 4) = uVar1;
    *(undefined8 *)(_value_local + 6) = uVar2;
    *(undefined8 *)(_value_local + 8) = uVar1;
    *(undefined8 *)(_value_local + 10) = uVar2;
    *(undefined8 *)(_value_local + 0xc) = uVar1;
    *(undefined8 *)(_value_local + 0xe) = uVar2;
    _value_local = _value_local + 0x10;
    vector_data[1]._4_4_ = vector_data[1]._4_4_ + -0x10;
  }
  if (7 < vector_data[1]._4_4_) {
    *(undefined8 *)_value_local = uVar1;
    *(undefined8 *)(_value_local + 2) = uVar2;
    *(undefined8 *)(_value_local + 4) = uVar1;
    *(undefined8 *)(_value_local + 6) = uVar2;
    _value_local = _value_local + 8;
    vector_data[1]._4_4_ = vector_data[1]._4_4_ + -8;
  }
  if (3 < vector_data[1]._4_4_) {
    *(undefined8 *)_value_local = uVar1;
    *(undefined8 *)(_value_local + 2) = uVar2;
    _value_local = _value_local + 4;
    vector_data[1]._4_4_ = vector_data[1]._4_4_ + -4;
  }
  for (; vector_data[1]._4_4_ != 0; vector_data[1]._4_4_ = vector_data[1]._4_4_ + -1) {
    *_value_local = value;
    _value_local = _value_local + 1;
  }
  return;
}

Assistant:

void plutovg_memfill32(unsigned int* dest, int length, unsigned int value)
{
    __m128i vector_data = _mm_set_epi32(value, value, value, value);
    while(length && ((uintptr_t)dest & 0xf)) {
        *dest++ = value;
        length--;
    }

    while(length >= 32) {
        _mm_store_si128((__m128i*)(dest), vector_data);
        _mm_store_si128((__m128i*)(dest + 4), vector_data);
        _mm_store_si128((__m128i*)(dest + 8), vector_data);
        _mm_store_si128((__m128i*)(dest + 12), vector_data);
        _mm_store_si128((__m128i*)(dest + 16), vector_data);
        _mm_store_si128((__m128i*)(dest + 20), vector_data);
        _mm_store_si128((__m128i*)(dest + 24), vector_data);
        _mm_store_si128((__m128i*)(dest + 28), vector_data);

        dest += 32;
        length -= 32;
    }

    if(length >= 16) {
        _mm_store_si128((__m128i*)(dest), vector_data);
        _mm_store_si128((__m128i*)(dest + 4), vector_data);
        _mm_store_si128((__m128i*)(dest + 8), vector_data);
        _mm_store_si128((__m128i*)(dest + 12), vector_data);

        dest += 16;
        length -= 16;
    }

    if(length >= 8) {
        _mm_store_si128((__m128i*)(dest), vector_data);
        _mm_store_si128((__m128i*)(dest + 4), vector_data);

        dest += 8;
        length -= 8;
    }

    if(length >= 4) {
        _mm_store_si128((__m128i*)(dest), vector_data);

        dest += 4;
        length -= 4;
    }

    while(length) {
        *dest++ = value;
        length--;
    }
}